

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdReport.cpp
# Opt level: O3

int CmdReport(CLI *cli,Rules *rules,Database *database,Extensions *extensions)

{
  IntervalFilterAllInRange *pIVar1;
  IntervalFilterAllWithTags *pIVar2;
  undefined8 uVar3;
  CLI *this;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  string *psVar8;
  string *psVar9;
  IntervalFilterAllWithTags *pIVar10;
  long lVar11;
  pointer pbVar12;
  undefined8 uVar13;
  char *__end;
  pointer pbVar14;
  pointer pcVar15;
  initializer_list<std::shared_ptr<IntervalFilter>_> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  string script_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  string default_hint;
  string report_hint;
  string script_path;
  IntervalFilterAndGroup filtering;
  stringstream header;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  vector<Interval,_std::allocator<Interval>_> tracked;
  Range range;
  undefined1 local_498 [32];
  undefined1 local_478 [40];
  Rules *local_450;
  string local_448;
  undefined1 local_428 [40];
  pointer local_400;
  string local_3f8;
  undefined1 local_3d8 [32];
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  time_t tStack_3a8;
  Datetime local_3a0;
  undefined1 local_370 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  Extensions *local_330;
  string local_328;
  IntervalFilterAndGroup local_308;
  Database *local_2e0;
  CLI *local_2d8;
  pointer local_2d0;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Alloc_hider local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [5];
  ios_base local_248 [272];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [48];
  vector<Interval,_std::allocator<Interval>_> local_e8;
  vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Range local_98;
  
  local_350._M_allocated_capacity = (size_type)&local_340;
  local_350._8_8_ = 0;
  local_340._M_local_buf[0] = '\0';
  local_400 = (cli->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2d0 = (cli->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_450 = rules;
  local_330 = extensions;
  local_2e0 = database;
  local_2d8 = cli;
  if (local_400 == local_2d0) {
LAB_001457b3:
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar8 = psVar8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar8,"Specify which report to run.","");
    __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  do {
    pcVar15 = local_2c8 + 0x10;
    local_2c8._0_8_ = pcVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"EXT","");
    bVar4 = A2::hasTag(local_400,(string *)local_2c8);
    if ((pointer)local_2c8._0_8_ != pcVar15) {
      operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
    }
    if (bVar4) {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"canonical","");
      A2::attribute(&local_448,local_400,&local_3f8);
      Extensions::all_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_370,local_330);
      uVar13 = local_370._8_8_;
      local_498._0_8_ = (IntervalFilterAllInRange *)0x0;
      local_498._8_8_ = (pointer)0x0;
      local_498._16_8_ = 0;
      for (psVar9 = (string *)local_370._0_8_; psVar9 != (string *)uVar13; psVar9 = psVar9 + 1) {
        Path::Path((Path *)local_2c8,psVar9);
        Path::name_abi_cxx11_((string *)local_3d8,(Path *)local_2c8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_498,
                   (string *)local_3d8);
        if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
        }
        if (local_2a8._M_p != local_2c8 + 0x30) {
          operator_delete(local_2a8._M_p,local_298[0]._M_allocated_capacity + 1);
        }
        if ((pointer)local_2c8._0_8_ != pcVar15) {
          operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
        }
      }
      local_478._0_8_ = (IntervalFilterAllWithTags *)0x0;
      local_478._8_8_ = (IntervalFilterAllWithTags *)0x0;
      local_478._16_8_ = (pointer)0x0;
      autoComplete(&local_448,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_498,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_478,1);
      uVar13 = local_370._8_8_;
      if (local_478._0_8_ == local_478._8_8_) {
        psVar9 = (string *)__cxa_allocate_exception(0x20);
        local_2c8._0_8_ = pcVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2c8,"The report \'{1}\' is not recognized.","");
        local_3d8._0_8_ = local_3d8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,local_448._M_dataplus._M_p,
                   local_448._M_dataplus._M_p + local_448._M_string_length);
        format<std::__cxx11::string>
                  (psVar9,(string *)local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
        __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      psVar9 = (string *)local_370._0_8_;
      if (0x20 < (ulong)(local_478._8_8_ - local_478._0_8_)) {
        psVar9 = (string *)__cxa_allocate_exception(0x20);
        local_2c8._0_8_ = local_2c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2c8,"The report \'{1}\' is ambiguous, and could mean one of: {2}"
                   ,"");
        local_3d8._0_8_ = local_3d8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,local_448._M_dataplus._M_p,
                   local_448._M_dataplus._M_p + local_448._M_string_length);
        local_118._0_8_ = local_118 + 0x10;
        local_118._16_2_ = 0x202c;
        local_118._8_8_ = 2;
        local_118[0x12] = '\0';
        join((string *)&local_98,(string *)local_118,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_478);
        format<std::__cxx11::string,std::__cxx11::string>
                  (psVar9,(string *)local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      for (; psVar9 != (string *)uVar13; psVar9 = psVar9 + 1) {
        Path::Path((Path *)local_2c8,psVar9);
        Path::name_abi_cxx11_((string *)local_3d8,(Path *)local_2c8);
        uVar3 = local_3d8._0_8_;
        if (local_3d8._8_8_ == *(size_t *)(local_478._0_8_ + 8)) {
          if (local_3d8._8_8_ == 0) {
            bVar4 = true;
          }
          else {
            iVar5 = bcmp((void *)local_3d8._0_8_,*(void **)local_478._0_8_,local_3d8._8_8_);
            bVar4 = iVar5 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if ((undefined1 *)uVar3 != local_3d8 + 0x10) {
          operator_delete((void *)uVar3,local_3d8._16_8_ + 1);
        }
        if (local_2a8._M_p != local_2c8 + 0x30) {
          operator_delete(local_2a8._M_p,local_298[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
          operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_308.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&local_308._filters;
          pcVar15 = (psVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_308,pcVar15,pcVar15 + psVar9->_M_string_length);
          goto LAB_00144b13;
        }
      }
      local_308.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&local_308._filters;
      local_308.super_IntervalFilter._done = false;
      local_308.super_IntervalFilter._9_7_ = 0;
      local_308._filters.
      super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
LAB_00144b13:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_478);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_370);
      std::__cxx11::string::operator=((string *)local_350._M_local_buf,(string *)&local_308);
      if ((vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
           *)local_308.super_IntervalFilter._vptr_IntervalFilter != &local_308._filters) {
        operator_delete(local_308.super_IntervalFilter._vptr_IntervalFilter,
                        CONCAT71(local_308._filters.
                                 super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_308._filters.
                                 super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar15 = local_2c8 + 0x10;
    local_400 = local_400 + 1;
  } while (local_400 != local_2d0);
  if (local_350._8_8_ == 0) goto LAB_001457b3;
  getScriptName(&local_448,(string *)&local_350);
  local_2c8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"reports.range","");
  local_3d8._0_8_ = local_3d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"all","");
  Rules::get(&local_3f8,local_450,(string *)local_2c8,(string *)local_3d8);
  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if ((pointer)local_2c8._0_8_ != pcVar15) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  local_3d8._0_8_ = local_3d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"reports.{1}.range","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_448._M_dataplus._M_p,
             local_448._M_dataplus._M_p + local_448._M_string_length);
  format<std::__cxx11::string>((string *)local_2c8,(string *)local_3d8,&local_138);
  Rules::get((string *)local_370,local_450,(string *)local_2c8,&local_3f8);
  if ((pointer)local_2c8._0_8_ != pcVar15) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  this = local_2d8;
  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  local_3a0._utc = false;
  local_3a0._33_7_ = 0;
  local_3a0._date = 0;
  local_3a0._julian = 0;
  local_3a0._day = 0;
  local_3a0._seconds = 0;
  local_3a0._offset = 0;
  local_3a0._year = 0;
  local_3a0._month = 0;
  local_3a0._week = 0;
  local_3a0._weekday = 0;
  local_3b0._0_1_ = false;
  local_3b0._1_7_ = 0;
  tStack_3a8 = 0;
  local_3d8._24_8_ = 0;
  uStack_3b8._0_4_ = 0;
  uStack_3b8._4_4_ = 0;
  local_3d8._8_8_ = 0;
  local_3d8._16_8_ = 0;
  local_3d8._0_8_ = &PTR__Range_0019f778;
  Datetime::Datetime((Datetime *)(local_3d8 + 8),0);
  Datetime::Datetime(&local_3a0,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,":",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370);
  expandIntervalHint((string *)local_2c8,(Range *)local_3d8);
  if ((pointer)local_2c8._0_8_ != pcVar15) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  CLI::getTags_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118,this);
  CLI::getRange(&local_98,this,(Range *)local_3d8);
  local_498._0_8_ = (IntervalFilterAllInRange *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IntervalFilterAllInRange,std::allocator<IntervalFilterAllInRange>,Range&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_498 + 8),
             (IntervalFilterAllInRange **)local_498,(allocator<IntervalFilterAllInRange> *)local_478
             ,&local_98);
  local_2c8._0_8_ = local_498._0_8_;
  local_2c8._8_8_ = local_498._8_8_;
  local_498._0_8_ = (IntervalFilterAllInRange *)0x0;
  local_498._8_8_ = (pointer)0x0;
  local_478._0_8_ = (IntervalFilterAllWithTags *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IntervalFilterAllWithTags,std::allocator<IntervalFilterAllWithTags>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_478 + 8),
             (IntervalFilterAllWithTags **)local_478,
             (allocator<IntervalFilterAllWithTags> *)local_428,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118);
  local_2b8._M_allocated_capacity = local_478._0_8_;
  local_2b8._8_8_ = local_478._8_8_;
  local_478._0_8_ = (IntervalFilterAllWithTags *)0x0;
  local_478._8_8_ = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_2c8;
  std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
  vector(&local_d0,__l,(allocator_type *)local_428);
  IntervalFilterAndGroup::IntervalFilterAndGroup(&local_308,&local_d0);
  std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
  ~vector(&local_d0);
  lVar11 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2d0 + lVar11) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2d0 + lVar11));
    }
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != 0);
  if ((pointer)local_478._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._8_8_);
  }
  if ((pointer)local_498._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
  }
  getTracked(&local_e8,local_2e0,local_450,&local_308.super_IntervalFilter);
  local_2c8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"temp.report.start","");
  bVar4 = Range::is_started(&local_98);
  if (bVar4) {
    Datetime::toISO_abi_cxx11_((string *)local_498,&local_98.start);
  }
  else {
    local_498._0_8_ = local_498 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"");
  }
  Rules::set(local_450,(string *)local_2c8,(string *)local_498);
  pIVar1 = (IntervalFilterAllInRange *)(local_498 + 0x10);
  if ((IntervalFilterAllInRange *)local_498._0_8_ != pIVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  if ((pointer)local_2c8._0_8_ != pcVar15) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  local_2c8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"temp.report.end","");
  bVar4 = Range::is_ended(&local_98);
  if (bVar4) {
    Datetime::toISO_abi_cxx11_((string *)local_498,&local_98.end);
  }
  else {
    local_498._0_8_ = pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"");
  }
  Rules::set(local_450,(string *)local_2c8,(string *)local_498);
  if ((IntervalFilterAllInRange *)local_498._0_8_ != pIVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  if ((pointer)local_2c8._0_8_ != pcVar15) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  local_2c8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"temp.report.tags","");
  local_478._0_8_ = (IntervalFilterAllWithTags *)(local_478 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,",","");
  joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((string *)local_498,(string *)local_478,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118);
  Rules::set(local_450,(string *)local_2c8,(string *)local_498);
  if ((IntervalFilterAllInRange *)local_498._0_8_ != pIVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  if ((IntervalFilterAllWithTags *)local_478._0_8_ !=
      (IntervalFilterAllWithTags *)(local_478 + 0x10)) {
    operator_delete((void *)local_478._0_8_,(ulong)(local_478._16_8_ + 1));
  }
  if ((pointer)local_2c8._0_8_ != pcVar15) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  local_2c8._0_8_ = pcVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"temp.version","");
  local_498._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"1.8.0-dev","");
  Rules::set(local_450,(string *)local_2c8,(string *)local_498);
  if ((IntervalFilterAllInRange *)local_498._0_8_ != pIVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  if ((pointer)local_2c8._0_8_ != pcVar15) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_2c8);
  local_498._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"");
  Rules::all((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_428,local_450,(string *)local_498);
  if ((IntervalFilterAllInRange *)local_498._0_8_ != pIVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  uVar13 = local_428._8_8_;
  if (local_428._0_8_ != local_428._8_8_) {
    psVar9 = (string *)local_428._0_8_;
    do {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_2c8 + 0x10),(psVar9->_M_dataplus)._M_p,
                          psVar9->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      local_478._0_8_ = local_478 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"","");
      Rules::get((string *)local_498,local_450,psVar9,(string *)local_478);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_498._0_8_,local_498._8_8_);
      local_328._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_328,1);
      if ((IntervalFilterAllInRange *)local_498._0_8_ !=
          (IntervalFilterAllInRange *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      if ((IntervalFilterAllWithTags *)local_478._0_8_ !=
          (IntervalFilterAllWithTags *)(local_478 + 0x10)) {
        operator_delete((void *)local_478._0_8_,(ulong)(local_478._16_8_ + 1));
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != (string *)uVar13);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::__cxx11::stringbuf::str();
  plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_428,local_428._8_8_,0,'\x01');
  pIVar2 = (IntervalFilterAllWithTags *)(local_478 + 0x10);
  pIVar10 = (IntervalFilterAllWithTags *)(plVar7 + 2);
  if ((IntervalFilterAllWithTags *)*plVar7 == pIVar10) {
    local_478._16_8_ = (pIVar10->super_IntervalFilter)._vptr_IntervalFilter;
    local_478._24_8_ = plVar7[3];
    local_478._0_8_ = pIVar2;
  }
  else {
    local_478._16_8_ = (pIVar10->super_IntervalFilter)._vptr_IntervalFilter;
    local_478._0_8_ = (IntervalFilterAllWithTags *)*plVar7;
  }
  local_478._8_8_ = plVar7[1];
  *plVar7 = (long)pIVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  jsonFromIntervals_abi_cxx11_(&local_328,&local_e8);
  pbVar14 = (pointer)((long)&((_Alloc_hider *)local_478._8_8_)->_M_p + local_328._M_string_length);
  pbVar12 = (pointer)0xf;
  if ((IntervalFilterAllWithTags *)local_478._0_8_ != pIVar2) {
    pbVar12 = (pointer)local_478._16_8_;
  }
  if (pbVar12 < pbVar14) {
    uVar13 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_328._M_dataplus._M_p._1_7_,local_328._M_dataplus._M_p._0_1_) !=
        &local_328.field_2) {
      uVar13 = local_328.field_2._M_allocated_capacity;
    }
    if (pbVar14 <= (ulong)uVar13) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_328,0,(char *)0x0,local_478._0_8_);
      goto LAB_00145401;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append
                             (local_478,
                              (ulong)CONCAT71(local_328._M_dataplus._M_p._1_7_,
                                              local_328._M_dataplus._M_p._0_1_));
LAB_00145401:
  pIVar1 = (IntervalFilterAllInRange *)(plVar7 + 2);
  if ((IntervalFilterAllInRange *)*plVar7 == pIVar1) {
    local_498._16_8_ = (pIVar1->super_IntervalFilter)._vptr_IntervalFilter;
    local_498._24_8_ = plVar7[3];
    local_498._0_8_ = (IntervalFilterAllInRange *)(local_498 + 0x10);
  }
  else {
    local_498._16_8_ = (pIVar1->super_IntervalFilter)._vptr_IntervalFilter;
    local_498._0_8_ = (IntervalFilterAllInRange *)*plVar7;
  }
  local_498._8_8_ = plVar7[1];
  *plVar7 = (long)pIVar1;
  plVar7[1] = 0;
  *(undefined1 *)&(pIVar1->super_IntervalFilter)._vptr_IntervalFilter = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_328._M_dataplus._M_p._1_7_,local_328._M_dataplus._M_p._0_1_) !=
      &local_328.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_328._M_dataplus._M_p._1_7_,local_328._M_dataplus._M_p._0_1_),
                    (ulong)(local_328.field_2._M_allocated_capacity + 1));
  }
  if ((IntervalFilterAllWithTags *)local_478._0_8_ != pIVar2) {
    operator_delete((void *)local_478._0_8_,(ulong)(local_478._16_8_ + 1));
  }
  if ((string *)local_428._0_8_ != (string *)(local_428 + 0x10)) {
    operator_delete((void *)local_428._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_428._16_8_)->_M_p + 1));
  }
  local_428._0_8_ = (pointer)0x0;
  local_428._8_8_ = (pointer)0x0;
  local_428._16_8_ = (pointer)0x0;
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_478,(string *)local_498,'\n');
  iVar5 = Extensions::callExtension
                    (local_330,(string *)&local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_478,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_478);
  uVar13 = local_428._8_8_;
  if (local_428._0_8_ != local_428._8_8_ || iVar5 == 0) {
    if (local_428._0_8_ != local_428._8_8_) {
      pbVar14 = (pointer)local_428._0_8_;
      do {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pbVar14->_M_dataplus)._M_p,
                            pbVar14->_M_string_length);
        local_478[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_478,1);
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != (pointer)uVar13);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_428);
    if ((IntervalFilterAllInRange *)local_498._0_8_ !=
        (IntervalFilterAllInRange *)(local_498 + 0x10)) {
      operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
    std::ios_base::~ios_base(local_248);
    std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_e8);
    local_308.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&PTR_accepts_0019f8f0;
    std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
    ::~vector(&local_308._filters);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
    if ((string *)local_370._0_8_ != (string *)(local_370 + 0x10)) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_allocated_capacity != &local_340) {
      operator_delete((void *)local_350._M_allocated_capacity,
                      CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) + 1)
      ;
    }
    return iVar5;
  }
  psVar9 = (string *)__cxa_allocate_exception(0x20);
  local_478._0_8_ = local_478 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_478,"\'{1}\' returned {2} without producing output.","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_350._M_allocated_capacity,
             local_350._8_8_ + local_350._M_allocated_capacity);
  format<std::__cxx11::string,int>(psVar9,(string *)local_478,&local_b8,iVar5);
  __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int CmdReport (
  CLI& cli,
  Rules& rules,
  Database& database,
  const Extensions& extensions)
{
  std::string script_path;
  for (auto& arg : cli._args)
  {
    if (arg.hasTag ("EXT"))
    {
      script_path = findExtension (extensions, arg.attribute ("canonical"));
    }
  }

  if (script_path.empty ())
  {
    throw std::string ("Specify which report to run.");
  }

  auto script_name = getScriptName (script_path);
  auto default_hint = rules.get ("reports.range", "all");
  auto report_hint = rules.get (format ("reports.{1}.range", script_name), default_hint);

  Range default_range = {};
  expandIntervalHint (":" + report_hint, default_range);

  // Create a filter, and if empty, choose the current week.
  auto tags = cli.getTags ();
  auto range = cli.getRange (default_range);

  IntervalFilterAndGroup filtering ({
    std::make_shared <IntervalFilterAllInRange> (range),
    std::make_shared <IntervalFilterAllWithTags> (tags)
  });

  auto tracked = getTracked (database, rules, filtering);

  // Compose Header info.
  rules.set ("temp.report.start", range.is_started () ? range.start.toISO () : "");
  rules.set ("temp.report.end",   range.is_ended ()   ? range.end.toISO ()   : "");
  rules.set ("temp.report.tags", joinQuotedIfNeeded (",", tags));
  rules.set ("temp.version", VERSION);

  std::stringstream header;

  for (auto& name : rules.all ())
  {
    header << name << ": " << rules.get (name) << '\n';
  }

  // Get the data.
  auto input = header.str ()
             + '\n'
             + jsonFromIntervals (tracked);

  // Run the extensions.
  std::vector <std::string> output;
  int rc = extensions.callExtension (script_path, split (input, '\n'), output);
  if (rc != 0 && output.empty ())
  {
    throw format ("'{1}' returned {2} without producing output.", script_path, rc);
  }

  // Display the output.
  for (auto& line : output)
  {
    std::cout << line << '\n';
  }

  return rc;
}